

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O3

void linear_reset(SRC_STATE *state)

{
  void *pvVar1;
  
  pvVar1 = state->private_data;
  if (pvVar1 != (void *)0x0) {
    *(undefined1 *)((long)pvVar1 + 4) = 0;
    memset(*(void **)((long)pvVar1 + 0x28),0,(long)state->channels << 2);
    return;
  }
  return;
}

Assistant:

static void
linear_reset (SRC_STATE *state)
{	LINEAR_DATA *priv = NULL ;

	priv = (LINEAR_DATA*) state->private_data ;
	if (priv == NULL)
		return ;

	priv->dirty = false ;
	memset (priv->last_value, 0, sizeof (priv->last_value [0]) * state->channels) ;

	return ;
}